

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O0

OpenMDBitSet * __thiscall
OpenMD::OpenMDBitSet::get(OpenMDBitSet *this,size_t fromIndex,size_t toIndex)

{
  back_insert_iterator<std::vector<bool,_std::allocator<bool>_>_> __result;
  _Bit_iterator __last;
  _Bit_iterator __first;
  _Bit_type *p_Var1;
  _Bit_type *p_Var2;
  uint uVar3;
  uint uVar4;
  OpenMDBitSet *in_RDI;
  iterator iVar5;
  iterator iVar6;
  iterator last;
  iterator first;
  OpenMDBitSet *result;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffee8;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar7;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff7c;
  
  std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x1acc06);
  std::operator+((iterator *)in_stack_fffffffffffffee8,0x1acc48);
  iVar5 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)0x1acc7f);
  p_Var1 = iVar5.super__Bit_iterator_base._M_p;
  uVar3 = iVar5.super__Bit_iterator_base._M_offset;
  iVar6 = std::operator+((iterator *)in_stack_fffffffffffffee8,0x1accc1);
  p_Var2 = iVar6.super__Bit_iterator_base._M_p;
  uVar4 = iVar6.super__Bit_iterator_base._M_offset;
  uVar7 = 0;
  OpenMDBitSet((OpenMDBitSet *)0x1accf7);
  std::back_inserter<std::vector<bool,std::allocator<bool>>>(in_stack_fffffffffffffee8);
  __first.super__Bit_iterator_base._M_offset = uVar3;
  __first.super__Bit_iterator_base._M_p = p_Var1;
  __first.super__Bit_iterator_base._12_4_ = in_stack_ffffffffffffff7c;
  __last.super__Bit_iterator_base._M_offset = uVar4;
  __last.super__Bit_iterator_base._M_p = p_Var2;
  __last.super__Bit_iterator_base._12_4_ = in_stack_ffffffffffffff6c;
  __result.container._7_1_ = uVar7;
  __result.container._0_7_ = in_stack_ffffffffffffff58;
  std::copy<std::_Bit_iterator,std::back_insert_iterator<std::vector<bool,std::allocator<bool>>>>
            (__first,__last,__result);
  return in_RDI;
}

Assistant:

OpenMDBitSet OpenMDBitSet::get(size_t fromIndex, size_t toIndex) {
    assert(fromIndex <= toIndex);
    assert(fromIndex >= 0);
    assert(toIndex <= size());
    std::vector<bool>::iterator first = bitset_.begin() + fromIndex;
    std::vector<bool>::iterator last  = bitset_.begin() + toIndex;

    OpenMDBitSet result;
    std::copy(first, last, std::back_inserter(result.bitset_));
    return result;
  }